

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

bool flatbuffers::EscapeString
               (char *s,size_t length,string *_text,bool allow_non_utf8,bool natural_utf8)

{
  byte bVar1;
  int mask;
  uint uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  int iVar4;
  undefined7 in_register_00000081;
  int iVar5;
  ulong uVar6;
  string local_70;
  undefined4 local_50;
  undefined4 local_4c;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  uVar3 = CONCAT71(in_register_00000009,allow_non_utf8);
  local_50 = (undefined4)CONCAT71(in_register_00000081,natural_utf8);
  local_4c = (undefined4)uVar3;
  std::__cxx11::string::append((char *)_text);
  if (length != 0) {
    local_48 = ~(ulong)s;
    local_38 = s + 2;
    local_40 = s + 1;
    uVar6 = 0;
    do {
      iVar5 = (int)uVar6;
      bVar1 = s[uVar6];
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_00144adb_caseD_b:
        if ((byte)(bVar1 - 0x20) < 0x5f) {
          std::__cxx11::string::push_back((char)_text);
        }
        else {
          uVar2 = 0x80;
          iVar4 = 0;
          do {
            if ((uVar2 & bVar1) == 0) {
              uVar2 = -iVar4;
              uVar3 = (ulong)uVar2;
              if (-1 < (char)(bVar1 << ((byte)uVar2 & 0x1f))) {
                if (iVar4 == 0) {
                  uVar2 = (uint)(char)bVar1;
                  if (-1 < (int)uVar2) {
                    if ((char)local_50 == '\0') {
                      if (uVar2 < 0x10000) {
                        std::__cxx11::string::append((char *)_text);
                        IntToStringHex_abi_cxx11_
                                  (&local_70,(flatbuffers *)(ulong)uVar2,4,(int)uVar3);
                        std::__cxx11::string::_M_append
                                  ((char *)_text,(ulong)local_70._M_dataplus._M_p);
                      }
                      else {
                        if (0x10ffff < uVar2) goto LAB_00144df3;
                        std::__cxx11::string::append((char *)_text);
                        IntToStringHex_abi_cxx11_
                                  (&local_70,
                                   (flatbuffers *)(ulong)((uVar2 - 0x10000 >> 10) + 0xd800),4,
                                   (int)uVar3);
                        std::__cxx11::string::_M_append
                                  ((char *)_text,(ulong)local_70._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_70._M_dataplus._M_p != &local_70.field_2) {
                          operator_delete(local_70._M_dataplus._M_p,
                                          local_70.field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::string::append((char *)_text);
                        IntToStringHex_abi_cxx11_
                                  (&local_70,(flatbuffers *)(ulong)(uVar2 & 0x3ff | 0xdc00),4,
                                   (int)uVar3);
                        std::__cxx11::string::_M_append
                                  ((char *)_text,(ulong)local_70._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p,
                                        local_70.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      std::__cxx11::string::append((char *)_text,(ulong)(s + uVar6));
                    }
LAB_00144df3:
                    iVar5 = (int)(s + uVar6) + 1 + (int)local_48;
                    goto LAB_00144b53;
                  }
                }
                else {
                  uVar3 = (ulong)CONCAT31((int3)(uVar2 >> 8),iVar4 == -1);
                  if (uVar2 < 5 && iVar4 != -1) {
                    uVar3 = (ulong)(byte)-(local_40[uVar6] & 0xc0U);
                  }
                }
              }
              break;
            }
            uVar2 = uVar2 >> 1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != -6);
          if ((char)local_4c == '\0') {
            return false;
          }
          std::__cxx11::string::append((char *)_text);
          IntToStringHex_abi_cxx11_(&local_70,(flatbuffers *)(ulong)(uint)bVar1,2,(int)uVar3);
          std::__cxx11::string::_M_append((char *)_text,(ulong)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00144b53;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((bVar1 != 0x22) && (bVar1 != 0x5c)) goto switchD_00144adb_caseD_b;
      }
      std::__cxx11::string::append((char *)_text);
LAB_00144b53:
      uVar6 = (ulong)(iVar5 + 1);
    } while (uVar6 < length);
  }
  std::__cxx11::string::append((char *)_text);
  return true;
}

Assistant:

inline bool EscapeString(const char *s, size_t length, std::string *_text,
                         bool allow_non_utf8, bool natural_utf8) {
  std::string &text = *_text;
  text += "\"";
  for (uoffset_t i = 0; i < length; i++) {
    char c = s[i];
    switch (c) {
      case '\n': text += "\\n"; break;
      case '\t': text += "\\t"; break;
      case '\r': text += "\\r"; break;
      case '\b': text += "\\b"; break;
      case '\f': text += "\\f"; break;
      case '\"': text += "\\\""; break;
      case '\\': text += "\\\\"; break;
      default:
        if (c >= ' ' && c <= '~') {
          text += c;
        } else {
          // Not printable ASCII data. Let's see if it's valid UTF-8 first:
          const char *utf8 = s + i;
          int ucc = FromUTF8(&utf8);
          if (ucc < 0) {
            if (allow_non_utf8) {
              text += "\\x";
              text += IntToStringHex(static_cast<uint8_t>(c), 2);
            } else {
              // There are two cases here:
              //
              // 1) We reached here by parsing an IDL file. In that case,
              // we previously checked for non-UTF-8, so we shouldn't reach
              // here.
              //
              // 2) We reached here by someone calling GenText()
              // on a previously-serialized flatbuffer. The data might have
              // non-UTF-8 Strings, or might be corrupt.
              //
              // In both cases, we have to give up and inform the caller
              // they have no JSON.
              return false;
            }
          } else {
            if (natural_utf8) {
              // utf8 points to past all utf-8 bytes parsed
              text.append(s + i, static_cast<size_t>(utf8 - s - i));
            } else if (ucc <= 0xFFFF) {
              // Parses as Unicode within JSON's \uXXXX range, so use that.
              text += "\\u";
              text += IntToStringHex(ucc, 4);
            } else if (ucc <= 0x10FFFF) {
              // Encode Unicode SMP values to a surrogate pair using two \u
              // escapes.
              uint32_t base = ucc - 0x10000;
              auto high_surrogate = (base >> 10) + 0xD800;
              auto low_surrogate = (base & 0x03FF) + 0xDC00;
              text += "\\u";
              text += IntToStringHex(high_surrogate, 4);
              text += "\\u";
              text += IntToStringHex(low_surrogate, 4);
            }
            // Skip past characters recognized.
            i = static_cast<uoffset_t>(utf8 - s - 1);
          }
        }
        break;
    }
  }
  text += "\"";
  return true;
}